

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_UnknownEdition_Test::TestBody
          (ParseEditionsTest_UnknownEdition_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,"1:18: Unknown edition \"UNKNOWN\".\n");
  text._M_str = 
  "\n        edition = \"UNKNOWN\";\n        message A {\n          optional int32 b = 1;\n        }"
  ;
  text._M_len = 0x5b;
  ParserTest::ExpectHasEarlyExitErrors
            (&this->super_ParseEditionsTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, UnknownEdition) {
  ExpectHasEarlyExitErrors(
      R"schema(
        edition = "UNKNOWN";
        message A {
          optional int32 b = 1;
        })schema",
      "1:18: Unknown edition \"UNKNOWN\".\n");
}